

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O0

void __thiscall
FIX::HttpConnection::showRow
          (HttpConnection *this,stringstream *s,string *name,int value,string *url)

{
  ostream *poVar1;
  TAG *pTVar2;
  allocator<char> local_16f1;
  string local_16f0;
  string local_16d0;
  undefined1 local_16b0 [8];
  A a_3;
  stringstream href_3;
  ostream local_14e8 [383];
  allocator<char> local_1369;
  string local_1368;
  string local_1348;
  undefined1 local_1328 [8];
  A a_2;
  stringstream href_2;
  ostream local_1160 [383];
  allocator<char> local_fe1;
  string local_fe0;
  string local_fc0;
  undefined1 local_fa0 [8];
  A a_1;
  stringstream href_1;
  ostream local_dd8 [383];
  allocator<char> local_c59;
  string local_c58;
  string local_c38;
  undefined1 local_c18 [8];
  A a;
  stringstream href;
  ostream local_a50 [376];
  undefined1 local_8d8 [8];
  CENTER center;
  TD td_2;
  TD td_1;
  TD td;
  undefined1 local_1e8 [8];
  TR tr;
  string *url_local;
  int value_local;
  string *name_local;
  stringstream *s_local;
  HttpConnection *this_local;
  
  tr.super_TAG.m_stream = (ostream *)url;
  HTML::TR::TR((TR *)local_1e8,(ostream *)(s + 0x10));
  HTML::TAG::text((TAG *)local_1e8);
  HTML::TD::TD((TD *)&td_1.super_TAG.m_stream,(ostream *)(s + 0x10));
  HTML::TAG::text((TAG *)&td_1.super_TAG.m_stream,name);
  HTML::TD::~TD((TD *)&td_1.super_TAG.m_stream);
  HTML::TD::TD((TD *)&td_2.super_TAG.m_stream,(ostream *)(s + 0x10));
  HTML::TAG::text((TAG *)&td_2.super_TAG.m_stream,value);
  HTML::TD::~TD((TD *)&td_2.super_TAG.m_stream);
  HTML::TD::TD((TD *)&center.super_TAG.m_stream,(ostream *)(s + 0x10));
  HTML::TAG::text((TAG *)&center.super_TAG.m_stream);
  HTML::CENTER::CENTER((CENTER *)local_8d8,(ostream *)(s + 0x10));
  HTML::TAG::text((TAG *)local_8d8);
  std::__cxx11::stringstream::stringstream((stringstream *)&a.super_TAG.m_stream);
  poVar1 = std::operator<<(local_a50,(string *)tr.super_TAG.m_stream);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<(poVar1,value + -10);
  HTML::A::A((A *)local_c18,(ostream *)(s + 0x10));
  std::__cxx11::stringstream::str();
  pTVar2 = &HTML::A::href((A *)local_c18,&local_c38)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c58,"<<",&local_c59);
  HTML::TAG::text(pTVar2,&local_c58);
  std::__cxx11::string::~string((string *)&local_c58);
  std::allocator<char>::~allocator(&local_c59);
  std::__cxx11::string::~string((string *)&local_c38);
  HTML::A::~A((A *)local_c18);
  std::__cxx11::stringstream::~stringstream((stringstream *)&a.super_TAG.m_stream);
  std::operator<<((ostream *)(s + 0x10),HTML::NBSP);
  std::__cxx11::stringstream::stringstream((stringstream *)&a_1.super_TAG.m_stream);
  poVar1 = std::operator<<(local_dd8,(string *)tr.super_TAG.m_stream);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<(poVar1,value + -1);
  HTML::A::A((A *)local_fa0,(ostream *)(s + 0x10));
  std::__cxx11::stringstream::str();
  pTVar2 = &HTML::A::href((A *)local_fa0,&local_fc0)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fe0,"<",&local_fe1);
  HTML::TAG::text(pTVar2,&local_fe0);
  std::__cxx11::string::~string((string *)&local_fe0);
  std::allocator<char>::~allocator(&local_fe1);
  std::__cxx11::string::~string((string *)&local_fc0);
  HTML::A::~A((A *)local_fa0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&a_1.super_TAG.m_stream);
  poVar1 = std::operator<<((ostream *)(s + 0x10),HTML::NBSP);
  poVar1 = std::operator<<(poVar1,"|");
  std::operator<<(poVar1,HTML::NBSP);
  std::__cxx11::stringstream::stringstream((stringstream *)&a_2.super_TAG.m_stream);
  poVar1 = std::operator<<(local_1160,(string *)tr.super_TAG.m_stream);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<(poVar1,value + 1);
  HTML::A::A((A *)local_1328,(ostream *)(s + 0x10));
  std::__cxx11::stringstream::str();
  pTVar2 = &HTML::A::href((A *)local_1328,&local_1348)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1368,">",&local_1369);
  HTML::TAG::text(pTVar2,&local_1368);
  std::__cxx11::string::~string((string *)&local_1368);
  std::allocator<char>::~allocator(&local_1369);
  std::__cxx11::string::~string((string *)&local_1348);
  HTML::A::~A((A *)local_1328);
  std::__cxx11::stringstream::~stringstream((stringstream *)&a_2.super_TAG.m_stream);
  std::operator<<((ostream *)(s + 0x10),HTML::NBSP);
  std::__cxx11::stringstream::stringstream((stringstream *)&a_3.super_TAG.m_stream);
  poVar1 = std::operator<<(local_14e8,(string *)tr.super_TAG.m_stream);
  poVar1 = std::operator<<(poVar1,"&");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<(poVar1,value + 10);
  HTML::A::A((A *)local_16b0,(ostream *)(s + 0x10));
  std::__cxx11::stringstream::str();
  pTVar2 = &HTML::A::href((A *)local_16b0,&local_16d0)->super_TAG;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_16f0,">>",&local_16f1);
  HTML::TAG::text(pTVar2,&local_16f0);
  std::__cxx11::string::~string((string *)&local_16f0);
  std::allocator<char>::~allocator(&local_16f1);
  std::__cxx11::string::~string((string *)&local_16d0);
  HTML::A::~A((A *)local_16b0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&a_3.super_TAG.m_stream);
  HTML::CENTER::~CENTER((CENTER *)local_8d8);
  HTML::TD::~TD((TD *)&center.super_TAG.m_stream);
  HTML::TR::~TR((TR *)local_1e8);
  return;
}

Assistant:

void HttpConnection::showRow
( std::stringstream& s, const std::string& name, int value, const std::string& url )
{
    { TR tr(s); tr.text();
      { TD td(s); td.text(name); }
      { TD td(s); td.text(value); }
      { TD td(s); td.text();
        CENTER center(s); center.text();
        {
          std::stringstream href;
          href << url << "&" << name << "=" << value - 10;
          A a(s); a.href(href.str()).text("<<");
        }
        s << NBSP;
        {
          std::stringstream href;
          href << url << "&" << name << "=" << value - 1;
          A a(s); a.href(href.str()).text("<");
        }
        s << NBSP << "|" << NBSP;
        {
          std::stringstream href;
          href << url << "&" << name << "=" << value + 1;
          A a(s); a.href(href.str()).text(">");
        }
        s << NBSP;
        {
          std::stringstream href;
          href << url << "&" << name << "=" << value + 10;
          A a(s); a.href(href.str()).text(">>");
        }
      }
    }
}